

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

callback<void_()> * __thiscall
booster::callback<void()>::operator=(callback<void()> *this,intrusive_ptr<mycall> *c)

{
  intrusive_ptr<booster::callable<void_()>_> iStack_18;
  
  intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr<mycall>(&iStack_18,c);
  intrusive_ptr<booster::callable<void_()>_>::operator=
            ((intrusive_ptr<booster::callable<void_()>_> *)this,&iStack_18);
  intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&iStack_18);
  return (callback<void_()> *)this;
}

Assistant:

callback const &operator=(intrusive_ptr<Call> c)		
		{ call_ptr = c; return *this; }